

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spend.cpp
# Opt level: O3

Result<wallet::SelectionResult> *
wallet::AttemptSelection
          (Result<wallet::SelectionResult> *__return_storage_ptr__,Chain *chain,
          CAmount *nTargetValue,OutputGroupTypeMap *groups,
          CoinSelectionParams *coin_selection_params,bool allow_mixed_output_types)

{
  _Rb_tree_header *p_Var1;
  _Variant_base<bilingual_str,_wallet::SelectionResult> *p_Var2;
  undefined1 *puVar3;
  pointer pSVar4;
  __normal_iterator<wallet::SelectionResult_*,_std::vector<wallet::SelectionResult,_std::allocator<wallet::SelectionResult>_>_>
  _Var5;
  bool bVar6;
  T *__x;
  _Base_ptr p_Var7;
  undefined8 uVar8;
  __normal_iterator<wallet::SelectionResult_*,_std::vector<wallet::SelectionResult,_std::allocator<wallet::SelectionResult>_>_>
  __it2;
  undefined8 uVar9;
  __normal_iterator<wallet::SelectionResult_*,_std::vector<wallet::SelectionResult,_std::allocator<wallet::SelectionResult>_>_>
  __it1;
  long in_FS_OFFSET;
  vector<wallet::SelectionResult,_std::allocator<wallet::SelectionResult>_> results;
  vector<wallet::SelectionResult,_std::allocator<wallet::SelectionResult>_> local_108;
  _Iter_less_iter local_e9;
  undefined8 *local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 *local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  _Variant_base<bilingual_str,_wallet::SelectionResult> local_a8;
  
  local_a8.super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
  super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
  super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
  super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
  super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._112_8_ =
       *(long *)(in_FS_OFFSET + 0x28);
  local_108.super__Vector_base<wallet::SelectionResult,_std::allocator<wallet::SelectionResult>_>.
  _M_impl.super__Vector_impl_data._M_start = (SelectionResult *)0x0;
  local_108.super__Vector_base<wallet::SelectionResult,_std::allocator<wallet::SelectionResult>_>.
  _M_impl.super__Vector_impl_data._M_finish = (SelectionResult *)0x0;
  local_108.super__Vector_base<wallet::SelectionResult,_std::allocator<wallet::SelectionResult>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var7 = (groups->groups_by_type)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(groups->groups_by_type)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var7 != p_Var1) {
    do {
      ChooseSelectionResult
                (__return_storage_ptr__,chain,nTargetValue,(Groups *)&p_Var7[1]._M_parent,
                 coin_selection_params);
      bVar6 = HasErrorMsg(__return_storage_ptr__);
      if (bVar6) goto LAB_00c0f68a;
      if (*(__index_type *)
           ((long)&(__return_storage_ptr__->m_variant).
                   super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                   super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                   super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x70) ==
          '\x01') {
        __x = util::Result<wallet::SelectionResult>::value(__return_storage_ptr__);
        std::vector<wallet::SelectionResult,_std::allocator<wallet::SelectionResult>_>::push_back
                  (&local_108,__x);
      }
      std::__detail::__variant::_Variant_storage<false,_bilingual_str,_wallet::SelectionResult>::
      ~_Variant_storage((_Variant_storage<false,_bilingual_str,_wallet::SelectionResult> *)
                        __return_storage_ptr__);
      p_Var7 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var7);
      pSVar4 = local_108.
               super__Vector_base<wallet::SelectionResult,_std::allocator<wallet::SelectionResult>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    } while ((_Rb_tree_header *)p_Var7 != p_Var1);
    if (local_108.
        super__Vector_base<wallet::SelectionResult,_std::allocator<wallet::SelectionResult>_>.
        _M_impl.super__Vector_impl_data._M_finish !=
        local_108.
        super__Vector_base<wallet::SelectionResult,_std::allocator<wallet::SelectionResult>_>.
        _M_impl.super__Vector_impl_data._M_start) {
      __it1._M_current =
           local_108.
           super__Vector_base<wallet::SelectionResult,_std::allocator<wallet::SelectionResult>_>.
           _M_impl.super__Vector_impl_data._M_start + 1;
      __it2._M_current =
           local_108.
           super__Vector_base<wallet::SelectionResult,_std::allocator<wallet::SelectionResult>_>.
           _M_impl.super__Vector_impl_data._M_start;
      if (__it1._M_current !=
          local_108.
          super__Vector_base<wallet::SelectionResult,_std::allocator<wallet::SelectionResult>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        do {
          bVar6 = __gnu_cxx::__ops::_Iter_less_iter::operator()(&local_e9,__it1,__it2);
          _Var5._M_current = __it1._M_current;
          if (!bVar6) {
            _Var5._M_current = __it2._M_current;
          }
          __it2._M_current = _Var5._M_current;
          __it1._M_current = __it1._M_current + 1;
        } while (__it1._M_current != pSVar4);
      }
      std::
      _Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
      ::_Rb_tree((_Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
                  *)&local_a8,
                 (_Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
                  *)__it2._M_current);
      local_a8.super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
      super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
      super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
      super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
      super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u._48_8_ =
           (__it2._M_current)->m_target;
      local_a8.super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
      super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
      super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
      super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
      super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u._56_1_ =
           (__it2._M_current)->m_algo;
      local_a8.super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
      super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
      super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
      super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
      super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u._57_1_ =
           (__it2._M_current)->m_use_effective;
      local_a8.super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
      super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
      super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
      super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
      super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u._58_6_ =
           *(undefined6 *)&(__it2._M_current)->field_0x3a;
      local_a8.super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
      super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
      super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
      super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
      super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u._64_8_ =
           ((__it2._M_current)->m_waste).super__Optional_base<long,_true,_true>._M_payload.
           super__Optional_payload_base<long>._M_payload;
      local_a8.super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
      super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
      super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
      super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
      super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u._72_8_ =
           *(undefined8 *)
            &((__it2._M_current)->m_waste).super__Optional_base<long,_true,_true>._M_payload.
             super__Optional_payload_base<long>._M_engaged;
      local_a8.super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
      super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
      super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
      super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
      super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u._80_8_ =
           *(undefined8 *)&(__it2._M_current)->m_algo_completed;
      local_a8.super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
      super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
      super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
      super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
      super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u._88_8_ =
           (__it2._M_current)->m_selections_evaluated;
      local_a8.super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
      super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
      super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
      super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
      super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u._96_8_ =
           *(undefined8 *)&(__it2._M_current)->m_weight;
      local_a8.super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
      super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
      super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
      super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
      super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u._104_8_ =
           (__it2._M_current)->bump_fee_group_discount;
      uVar8 = (long)&(__return_storage_ptr__->m_variant).
                     super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                     super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                     super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 8;
      if (local_a8.super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
          super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
          super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
          super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
          super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u._16_8_ == 0) {
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x10) = 0;
        p_Var2 = &(__return_storage_ptr__->m_variant).
                  super__Variant_base<bilingual_str,_wallet::SelectionResult>;
        local_a8.super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
        super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
        super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
        super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
        super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u._8_4_ = 0;
        uVar9 = uVar8;
      }
      else {
        puVar3 = (undefined1 *)
                 ((long)&local_a8.super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                         super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult> + 8);
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x10) =
             local_a8.super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u._16_8_;
        *(undefined8 *)
         (local_a8.super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
          super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
          super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
          super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
          super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u._16_8_ + 8) =
             uVar8;
        p_Var2 = &local_a8;
        *(undefined8 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x28) =
             local_a8.super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u._40_8_;
        local_a8.super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
        super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
        super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
        super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
        super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u._16_8_ = 0;
        uVar8 = local_a8.super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u._24_8_;
        uVar9 = local_a8.super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u._32_8_;
        local_a8.super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
        super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
        super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
        super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
        super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u._24_8_ = puVar3;
        local_a8.super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
        super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
        super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
        super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
        super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u._32_8_ = puVar3;
      }
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::SelectionResult>.
               super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x18) = uVar8;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::SelectionResult>.
               super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x20) = uVar9;
      *(undefined8 *)
       ((long)&(p_Var2->super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>).
               super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult> + 0x28) = 0;
      *(undefined4 *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::SelectionResult>.
               super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 8) =
           local_a8.super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
           super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
           super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
           super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
           super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u._8_4_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::SelectionResult>.
               super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x30) =
           local_a8.super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
           super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
           super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
           super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
           super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u._48_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::SelectionResult>.
               super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x38) =
           local_a8.super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
           super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
           super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
           super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
           super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u._56_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::SelectionResult>.
               super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x40) =
           local_a8.super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
           super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
           super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
           super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
           super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u._64_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::SelectionResult>.
               super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x48) =
           local_a8.super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
           super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
           super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
           super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
           super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u._72_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::SelectionResult>.
               super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x50) =
           local_a8.super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
           super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
           super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
           super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
           super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u._80_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::SelectionResult>.
               super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x58) =
           local_a8.super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
           super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
           super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
           super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
           super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u._88_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::SelectionResult>.
               super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x60) =
           local_a8.super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
           super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
           super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
           super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
           super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u._96_8_;
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::SelectionResult>.
               super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x68) =
           local_a8.super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
           super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
           super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
           super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
           super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_u._104_8_;
      *(__index_type *)
       ((long)&(__return_storage_ptr__->m_variant).
               super__Variant_base<bilingual_str,_wallet::SelectionResult>.
               super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
               super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
               super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x70) = '\x01'
      ;
      std::
      _Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
      ::~_Rb_tree((_Rb_tree<std::shared_ptr<wallet::COutput>,_std::shared_ptr<wallet::COutput>,_std::_Identity<std::shared_ptr<wallet::COutput>_>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
                   *)&local_a8);
      goto LAB_00c0f68a;
    }
  }
  if ((allow_mixed_output_types) &&
     (1 < (groups->groups_by_type)._M_t._M_impl.super__Rb_tree_header._M_node_count)) {
    ChooseSelectionResult
              (__return_storage_ptr__,chain,nTargetValue,&groups->all_groups,coin_selection_params);
  }
  else {
    local_e8 = &local_d8;
    uStack_b0 = 0;
    uStack_d0 = 0;
    local_c8 = &local_b8;
    *(undefined1 **)
     &(__return_storage_ptr__->m_variant).
      super__Variant_base<bilingual_str,_wallet::SelectionResult>.
      super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
      super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
      super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
      super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
      super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> =
         (undefined1 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x10);
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_wallet::SelectionResult>.
             super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x10) = 0;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_wallet::SelectionResult>.
             super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x18) = 0;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_wallet::SelectionResult>.
             super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 8) = 0;
    local_e0 = 0;
    local_d8 = 0;
    *(undefined1 **)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_wallet::SelectionResult>.
             super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x20) =
         (undefined1 *)
         ((long)&(__return_storage_ptr__->m_variant).
                 super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                 super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                 super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x30);
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_wallet::SelectionResult>.
             super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x30) = 0;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_wallet::SelectionResult>.
             super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x38) = 0;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_wallet::SelectionResult>.
             super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x28) = 0;
    uStack_c0 = 0;
    local_b8 = 0;
    *(__index_type *)
     ((long)&(__return_storage_ptr__->m_variant).
             super__Variant_base<bilingual_str,_wallet::SelectionResult>.
             super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
             super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
             super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult> + 0x70) = '\0';
  }
LAB_00c0f68a:
  std::vector<wallet::SelectionResult,_std::allocator<wallet::SelectionResult>_>::~vector
            (&local_108);
  if (*(long *)(in_FS_OFFSET + 0x28) !=
      local_a8.super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
      super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
      super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
      super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
      super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._112_8_) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

util::Result<SelectionResult> AttemptSelection(interfaces::Chain& chain, const CAmount& nTargetValue, OutputGroupTypeMap& groups,
                               const CoinSelectionParams& coin_selection_params, bool allow_mixed_output_types)
{
    // Run coin selection on each OutputType and compute the Waste Metric
    std::vector<SelectionResult> results;
    for (auto& [type, group] : groups.groups_by_type) {
        auto result{ChooseSelectionResult(chain, nTargetValue, group, coin_selection_params)};
        // If any specific error message appears here, then something particularly wrong happened.
        if (HasErrorMsg(result)) return result; // So let's return the specific error.
        // Append the favorable result.
        if (result) results.push_back(*result);
    }
    // If we have at least one solution for funding the transaction without mixing, choose the minimum one according to waste metric
    // and return the result
    if (results.size() > 0) return *std::min_element(results.begin(), results.end());

    // If we can't fund the transaction from any individual OutputType, run coin selection one last time
    // over all available coins, which would allow mixing.
    // If TypesCount() <= 1, there is nothing to mix.
    if (allow_mixed_output_types && groups.TypesCount() > 1) {
        return ChooseSelectionResult(chain, nTargetValue, groups.all_groups, coin_selection_params);
    }
    // Either mixing is not allowed and we couldn't find a solution from any single OutputType, or mixing was allowed and we still couldn't
    // find a solution using all available coins
    return util::Error();
}